

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

char * unescape_word(char *input)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  dynbuf out;
  dynbuf dStack_48;
  
  Curl_dyn_init(&dStack_48,10000);
  bVar1 = *input;
  while( true ) {
    if (bVar1 == 0) {
      pcVar3 = Curl_dyn_ptr(&dStack_48);
      return pcVar3;
    }
    if ((((byte)(bVar1 + 0x81) < 0xa2) ||
        ((bVar1 - 0x22 < 0x3b && ((0x400000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))
        ) && (CVar2 = Curl_dyn_addn(&dStack_48,"\\",1), CVar2 != CURLE_OK)) break;
    CVar2 = Curl_dyn_addn(&dStack_48,input,1);
    if (CVar2 != CURLE_OK) {
      return (char *)0x0;
    }
    bVar1 = input[1];
    input = input + 1;
  }
  return (char *)0x0;
}

Assistant:

static char *unescape_word(const char *input)
{
  struct dynbuf out;
  const char *ptr;
  CURLcode result = CURLE_OK;
  Curl_dyn_init(&out, DYN_DICT_WORD);

  /* According to RFC2229 section 2.2, these letters need to be escaped with
     \[letter] */
  for(ptr = input; *ptr; ptr++) {
    char ch = *ptr;
    if((ch <= 32) || (ch == 127) ||
       (ch == '\'') || (ch == '\"') || (ch == '\\'))
      result = Curl_dyn_addn(&out, "\\", 1);
    if(!result)
      result = Curl_dyn_addn(&out, ptr, 1);
    if(result)
      return NULL;
  }
  return Curl_dyn_ptr(&out);
}